

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcopy_to_ucol.c
# Opt level: O2

int zcopy_to_ucol(int jcol,int nseg,int *segrep,int *repfnz,int *perm_r,doublecomplex *dense,
                 GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  int_t iVar5;
  int_t *piVar6;
  int_t *piVar7;
  double *pdVar8;
  long lVar9;
  int *piVar10;
  int *piVar11;
  int next;
  void *pvVar12;
  int_t nzumax;
  int local_b4;
  int local_b0;
  int local_ac;
  int_t *local_a8;
  long local_a0;
  int_t *local_98;
  int *local_90;
  int *local_88;
  int *local_80;
  int *local_78;
  int *local_70;
  doublecomplex *local_68;
  long local_60;
  int_t *local_58;
  ulong local_50;
  doublecomplex zero;
  
  zero.r = 0.0;
  zero.i = 0.0;
  piVar10 = Glu->xsup;
  piVar11 = Glu->supno;
  local_a8 = Glu->lsub;
  local_58 = Glu->xlsub;
  pvVar12 = Glu->ucol;
  piVar6 = Glu->usub;
  local_98 = Glu->xusub;
  nzumax = Glu->nzumax;
  local_60 = (long)nseg;
  local_50 = 0;
  local_ac = 0;
  if (0 < nseg) {
    local_ac = nseg;
  }
  local_a0 = (long)jcol;
  local_b0 = piVar11[local_a0];
  next = local_98[local_a0];
  local_90 = piVar11;
  local_88 = piVar10;
  local_80 = segrep;
  local_78 = repfnz;
  local_70 = perm_r;
  local_68 = dense;
  do {
    if ((int)local_50 == local_ac) {
      local_98[local_a0 + 1] = next;
      return 0;
    }
    local_60 = local_60 + -1;
    iVar1 = segrep[local_60];
    if ((piVar11[iVar1] != local_b0) && (iVar2 = repfnz[iVar1], iVar2 != -1)) {
      local_b4 = (iVar2 - piVar10[piVar11[iVar1]]) + local_58[piVar10[piVar11[iVar1]]];
      piVar7 = local_a8;
      while (nzumax < next + (iVar1 - iVar2) + 1) {
        iVar5 = zLUMemXpand(jcol,next,UCOL,&nzumax,Glu);
        if (iVar5 != 0) {
          return iVar5;
        }
        pvVar12 = Glu->ucol;
        iVar5 = zLUMemXpand(jcol,next,USUB,&nzumax,Glu);
        if (iVar5 != 0) {
          return iVar5;
        }
        piVar7 = Glu->lsub;
        piVar6 = Glu->usub;
      }
      pdVar8 = (double *)((long)next * 0x10 + (long)pvVar12);
      for (lVar9 = 0; (int)lVar9 <= iVar1 - iVar2; lVar9 = lVar9 + 1) {
        iVar3 = piVar7[local_b4 + lVar9];
        piVar6[next + lVar9] = local_70[iVar3];
        dVar4 = local_68[iVar3].i;
        *pdVar8 = local_68[iVar3].r;
        pdVar8[1] = dVar4;
        local_68[iVar3].r = zero.r;
        local_68[iVar3].i = zero.i;
        pdVar8 = pdVar8 + 2;
      }
      next = next + (int)lVar9;
      repfnz = local_78;
      segrep = local_80;
      piVar10 = local_88;
      piVar11 = local_90;
      local_a8 = piVar7;
    }
    local_50 = (ulong)((int)local_50 + 1);
  } while( true );
}

Assistant:

int
zcopy_to_ucol(
	      int        jcol,	  /* in */
	      int        nseg,	  /* in */
	      int        *segrep,  /* in */
	      int        *repfnz,  /* in */
	      int        *perm_r,  /* in */
	      doublecomplex     *dense,   /* modified - reset to zero on return */
	      GlobalLU_t *Glu      /* modified */
	      )
{
/* 
 * Gather from SPA dense[*] to global ucol[*].
 */
    int ksub, krep, ksupno;
    int i, k, kfnz, segsze;
    int fsupc, irow, jsupno;
    int_t isub, nextu, new_next, mem_error;
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    doublecomplex    *ucol;
    int_t     *usub, *xusub;
    int_t       nzumax;
    doublecomplex zero = {0.0, 0.0};

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    ucol    = (doublecomplex *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    nzumax  = Glu->nzumax;
    
    jsupno = supno[jcol];
    nextu  = xusub[jcol];
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {
	krep = segrep[k--];
	ksupno = supno[krep];

	if ( ksupno != jsupno ) { /* Should go into ucol[] */
	    kfnz = repfnz[krep];
	    if ( kfnz != SLU_EMPTY ) {	/* Nonzero U-segment */

	    	fsupc = xsup[ksupno];
	        isub = xlsub[fsupc] + kfnz - fsupc;
	        segsze = krep - kfnz + 1;

		new_next = nextu + segsze;
		while ( new_next > nzumax ) {
		    mem_error = zLUMemXpand(jcol, nextu, UCOL, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    ucol = (doublecomplex *) Glu->ucol;
		    mem_error = zLUMemXpand(jcol, nextu, USUB, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    usub = Glu->usub;
		    lsub = Glu->lsub;
		}
		
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    usub[nextu] = perm_r[irow];
		    ucol[nextu] = dense[irow];
		    dense[irow] = zero;
		    nextu++;
		    isub++;
		} 

	    }

	}

    } /* for each segment... */

    xusub[jcol + 1] = nextu;      /* Close U[*,jcol] */
    return 0;
}